

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall
IR::Opnd::GetAddrDescription
          (Opnd *this,char16 *description,size_t count,bool AsmDumpMode,bool printToConsole,
          Func *func)

{
  size_t count_00;
  size_t description_00;
  AddrOpndKind addressKind;
  AddrOpnd *this_00;
  bool local_51;
  Var pvStack_50;
  bool isEncoded;
  Var address;
  AddrOpnd *addrOpnd;
  size_t n;
  char16 *buffer;
  Func *func_local;
  bool printToConsole_local;
  size_t sStack_20;
  bool AsmDumpMode_local;
  size_t count_local;
  char16 *description_local;
  Opnd *this_local;
  
  addrOpnd = (AddrOpnd *)count;
  n = (size_t)description;
  buffer = (char16 *)func;
  func_local._6_1_ = printToConsole;
  func_local._7_1_ = AsmDumpMode;
  sStack_20 = count;
  count_local = (size_t)description;
  description_local = (char16 *)this;
  this_00 = AsAddrOpnd(this);
  description_00 = count_local;
  count_00 = sStack_20;
  local_51 = this_00->decodedValue == (Var)0x0;
  if (local_51) {
    pvStack_50 = this_00->m_address;
  }
  else {
    pvStack_50 = this_00->decodedValue;
  }
  local_51 = !local_51;
  addressKind = AddrOpnd::GetAddrOpndKind(this_00);
  GetAddrDescription((char16 *)description_00,count_00,pvStack_50,addressKind,
                     (bool)(func_local._7_1_ & 1),(bool)(func_local._6_1_ & 1),(Func *)buffer,false)
  ;
  if (local_51) {
    if ((func_local._7_1_ & 1) == 0) {
      WriteToBuffer((char16 **)&n,(size_t *)&addrOpnd,L" [encoded: 0x%08X",this_00->m_address);
    }
    else {
      WriteToBuffer((char16 **)&n,(size_t *)&addrOpnd,L" [encoded]");
    }
  }
  *(undefined2 *)(count_local + (sStack_20 - 1) * 2) = 0;
  return;
}

Assistant:

void
Opnd::GetAddrDescription(__out_ecount(count) char16 *const description, const size_t count, bool AsmDumpMode,
                         bool printToConsole, Func *func)
{
    char16 *buffer = description;
    size_t n = count;

    IR::AddrOpnd * addrOpnd = this->AsAddrOpnd();
    Js::Var address;

    bool isEncoded = false;
    if (addrOpnd->decodedValue != 0)
    {
        address = addrOpnd->decodedValue;
        isEncoded = true;
    }
    else
    {
        address = addrOpnd->m_address;
    }

    GetAddrDescription(description, count, address, addrOpnd->GetAddrOpndKind(), AsmDumpMode, printToConsole, func);

    if (isEncoded)
    {
        if (AsmDumpMode)
        {
            WriteToBuffer(&buffer, &n, _u(" [encoded]"));
        }
        else
        {
            WriteToBuffer(&buffer, &n, _u(" [encoded: 0x%08X"), addrOpnd->m_address);
        }
    }

    description[count-1] = 0;  // force null termination
}